

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O3

exr_result_t exr_attr_chlist_init(exr_context_t ctxt,exr_attr_chlist_t *clist,int nchans)

{
  exr_result_t eVar1;
  exr_attr_chlist_entry_t *peVar2;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if (clist == (exr_attr_chlist_t *)0x0) {
      eVar1 = (**(code **)(ctxt + 0x40))
                        (ctxt,3,"Invalid channel list pointer to chlist_add_with_length");
      return eVar1;
    }
    if (nchans < 0) {
      eVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Negative number of channels requested (%d)",nchans,
                         *(code **)(ctxt + 0x48));
      return eVar1;
    }
    clist->num_channels = 0;
    clist->num_alloced = 0;
    clist->entries = (exr_attr_chlist_entry_t *)0x0;
    eVar1 = 0;
    if (nchans == 0) {
      peVar2 = (exr_attr_chlist_entry_t *)0x0;
    }
    else {
      peVar2 = (exr_attr_chlist_entry_t *)(**(code **)(ctxt + 0x58))((ulong)(uint)nchans << 5);
      if (peVar2 == (exr_attr_chlist_entry_t *)0x0) {
        eVar1 = (**(code **)(ctxt + 0x38))(ctxt,1);
        return eVar1;
      }
    }
    clist->entries = peVar2;
    clist->num_alloced = nchans;
  }
  return eVar1;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

exr_result_t
exr_attr_chlist_init (exr_context_t ctxt, exr_attr_chlist_t* clist, int nchans)
{
    exr_attr_chlist_t        nil = {0};
    exr_attr_chlist_entry_t* nlist;

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!clist)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid channel list pointer to chlist_add_with_length");

    if (nchans < 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Negative number of channels requested (%d)",
            nchans);

    *clist = nil;

    if (nchans > 0)
    {
        nlist = (exr_attr_chlist_entry_t*) pctxt->alloc_fn (
            sizeof (*nlist) * (size_t) nchans);
        if (nlist == NULL)
            return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);
    }
    else
        nlist = NULL;
    clist->entries     = nlist;
    clist->num_alloced = nchans;
    return EXR_ERR_SUCCESS;
}